

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O0

void __thiscall BufferedReader::notify(BufferedReader *this,int readerID,uint32_t dataReaded)

{
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lock;
  ReaderData *data;
  uint32_t dataReaded_local;
  int readerID_local;
  BufferedReader *this_local;
  
  data._0_4_ = dataReaded;
  data._4_4_ = readerID;
  _dataReaded_local = this;
  lock._M_device = (mutex_type *)getReader(this,readerID);
  if ((((ReaderData *)lock._M_device != (ReaderData *)0x0) &&
      ((this->super_AbstractReader).m_prereadThreshold <= (uint32_t)data)) &&
     ((((ReaderData *)lock._M_device)->m_notified & 1U) == 0)) {
    std::lock_guard<std::mutex>::lock_guard(&local_28,&this->m_readersMtx);
    ((lock._M_device)->super___mutex_base)._M_mutex.__size[9] = '\x01';
    *(int *)((long)&((lock._M_device)->super___mutex_base)._M_mutex + 0x14) =
         *(int *)((long)&((lock._M_device)->super___mutex_base)._M_mutex + 0x14) + 1;
    SafeQueueWithNotification<int>::push
              (&(this->m_readQueue).super_SafeQueueWithNotification<int>,(int *)((long)&data + 4));
    std::lock_guard<std::mutex>::~lock_guard(&local_28);
  }
  return;
}

Assistant:

void BufferedReader::notify(const int readerID, const uint32_t dataReaded)
{
    ReaderData* data = getReader(readerID);
    if (data == nullptr)
        return;
    if (dataReaded >= m_prereadThreshold && !data->m_notified)
    {
        std::lock_guard lock(m_readersMtx);
        data->m_notified = true;
        data->m_atQueue++;
        m_readQueue.push(readerID);
    }
}